

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,istream *i)

{
  parser p;
  stream_reader r;
  stream_reader local_2048;
  
  stream_reader::stream_reader(&local_2048,i,0xa00000,true);
  parse(this);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(istream &i)
{
    stream_reader r(&i, max_message_length, true);
    parser p(r);
    return p.parse();
}